

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.hpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::~ShaderPerformanceMeasurer(ShaderPerformanceMeasurer *this)

{
  pointer puVar1;
  
  deinit(this);
  puVar1 = (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_attribBuffers).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::~vector
            (&this->m_attributes);
  TheilSenCalibrator::~TheilSenCalibrator(&this->m_calibrator);
  return;
}

Assistant:

~ShaderPerformanceMeasurer	(void) { deinit(); }